

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

bool __thiscall IPStats::LoadCdnsRecords(IPStats *this,cdns *cdns_ctx,int *err)

{
  bool bVar1;
  size_t i;
  ulong packet_id;
  
  while( true ) {
    bVar1 = cdns::open_block(cdns_ctx,err);
    if (!bVar1) break;
    for (packet_id = 0;
        packet_id <
        (ulong)(((long)(cdns_ctx->block).queries.
                       super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(cdns_ctx->block).queries.
                      super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68); packet_id = packet_id + 1) {
      SubmitCborPacket(this,cdns_ctx,packet_id);
    }
  }
  return *err == -1;
}

Assistant:

bool IPStats::LoadCdnsRecords(cdns * cdns_ctx, int * err)
{
    bool ret = true;

    while (ret) {
        if (!cdns_ctx->open_block(err)) {
            ret = (*err == CBOR_END_OF_ARRAY);
            break;
        }
        for (size_t i = 0; i < cdns_ctx->block.queries.size(); i++) {
            SubmitCborPacket(cdns_ctx, i);
        }
    }
    return ret;
}